

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructReader * __thiscall
capnp::_::OrphanBuilder::asStructReader
          (StructReader *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  SegmentBuilder *segment;
  CapTableReader *capTable;
  word *refTarget;
  bool bVar1;
  int nestingLimit;
  WirePointer *pWVar2;
  Fault local_48;
  Fault f;
  undefined1 local_38 [8];
  DebugComparison<bool,_bool> _kjCondition;
  OrphanBuilder *this_local;
  StructSize size_local;
  
  _kjCondition._24_8_ = this;
  pWVar2 = tagAsPtr(this);
  f.exception._6_1_ = WirePointer::isNull(pWVar2);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  f.exception._5_1_ = this->location == (word *)0x0;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_38,
             (DebugExpression<bool> *)((long)&f.exception + 7),(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xe3d,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","_kjCondition,",
               (DebugComparison<bool,_bool> *)local_38);
    kj::_::Debug::Fault::fatal(&local_48);
  }
  segment = this->segment;
  capTable = &this->capTable->super_CapTableReader;
  pWVar2 = tagAsPtr(this);
  refTarget = this->location;
  nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  WireHelpers::readStructPointer
            (__return_storage_ptr__,&segment->super_SegmentReader,capTable,pWVar2,refTarget,
             (word *)0x0,nestingLimit);
  return __return_storage_ptr__;
}

Assistant:

StructReader OrphanBuilder::asStructReader(StructSize size) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readStructPointer(
      segment, capTable, tagAsPtr(), location, nullptr, kj::maxValue);
}